

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

PyObject * pybind11::cpp_function::dispatcher(PyObject *self,PyObject *args_in,PyObject *kwargs_in)

{
  uint __val;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer phVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  type_info *find_type;
  long lVar9;
  handle hVar10;
  handle hVar11;
  undefined8 *puVar12;
  long *plVar13;
  function_call *pfVar14;
  function_record *pfVar15;
  object *poVar16;
  error_already_set *this;
  instance *piVar17;
  ulong uVar18;
  byte bVar19;
  handle hVar20;
  handle hVar21;
  PyObject *pPVar22;
  PyTypeObject *pPVar23;
  function_record *pfVar24;
  PyObject *tmp;
  PyObject *pPVar25;
  size_type __new_size;
  uint __len;
  function_call *pfVar26;
  uint __uval;
  uint uVar27;
  function_call *pfVar28;
  bool bVar29;
  handle arg;
  tuple extra_args;
  dict kwargs_1;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  second_pass;
  loader_life_support guard_1;
  dict kwargs;
  value_and_holder self_value_and_holder;
  instance *pi;
  undefined1 local_1c8 [24];
  object oStack_1b0;
  pointer local_1a8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  pointer local_178;
  PyTypeObject *local_170;
  handle local_168;
  PyObject *local_160;
  undefined1 local_158 [32];
  undefined1 local_138 [8];
  undefined1 auStack_130 [16];
  handle *phStack_120;
  anon_union_24_2_63b86169_for_instance_1 local_118;
  handle hStack_100;
  pointer local_f8;
  handle hStack_f0;
  handle local_e8;
  handle local_e0;
  handle local_d8;
  PyObject *local_d0;
  function_call *local_c8;
  function_call *local_c0;
  handle local_b8;
  long local_b0;
  PyObject local_a8;
  undefined1 local_98 [40];
  PyObject *local_70;
  PyTypeObject *local_68;
  hashfunc local_58;
  handle local_50;
  handle local_48;
  handle local_40;
  object local_38;
  
  local_170 = (PyTypeObject *)PyCapsule_GetPointer(self,0);
  if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
    __assert_fail("PyTuple_Check(args_in)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Simon-Steinmann[P]ikfast_pybind_PR/ext/pybind11/include/pybind11/pybind11.h"
                  ,0x1b0,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  pPVar25 = (PyObject *)args_in[1].ob_refcnt;
  if (pPVar25 == (PyObject *)0x0) {
    local_68 = (PyTypeObject *)0x0;
  }
  else {
    local_68 = args_in[1].ob_type;
  }
  local_98._16_8_ = (type_info *)0x0;
  local_98._24_8_ = (handle *)0x0;
  local_98._0_8_ = (function_record *)0x0;
  local_98._8_8_ = (PyObject *)0x0;
  if (((ulong)local_170->tp_repr & 0x100) != 0) {
    find_type = detail::get_type_info((PyTypeObject *)local_170->tp_as_sequence);
    detail::instance::get_value_and_holder
              ((value_and_holder *)local_138,(instance *)local_68,find_type,false);
    local_98._16_8_ = auStack_130._8_8_;
    local_98._24_8_ = phStack_120;
    local_98._0_8_ = local_138;
    local_98._8_8_ = auStack_130._0_8_;
    if ((type_info *)auStack_130._8_8_ == (type_info *)0x0 || local_138 == (undefined1  [8])0x0) {
      PyErr_SetString(_PyExc_TypeError,"__init__(self, ...) called with invalid `self` argument");
      return (PyObject *)0x0;
    }
    bVar6 = (byte)((PyObject *)((long)local_138 + 0x30))->ob_refcnt;
    if ((bVar6 & 2) == 0) {
      bVar6 = *(byte *)((long)&(((PyObject *)((long)local_138 + 0x10))->ob_type->ob_base).ob_base.
                               ob_refcnt + (long)(PyObject **)auStack_130._0_8_) & 2;
    }
    else {
      bVar6 = bVar6 >> 3 & 1;
    }
    if (bVar6 != 0) {
      __Py_NoneStruct = __Py_NoneStruct + 1;
      local_138 = (undefined1  [8])0x0;
      object::~object((object *)local_138);
      return (PyObject *)&_Py_NoneStruct;
    }
  }
  local_158._0_8_ = (PyObject *)0x0;
  local_158._8_8_ = (function_call *)0x0;
  local_158._16_8_ = (pointer)0x0;
  local_58 = local_170->tp_hash;
  local_48.m_ptr = (PyObject *)&args_in[1].ob_type;
  local_70 = (PyObject *)0x1;
  hVar11.m_ptr = (PyObject *)local_170;
  local_160 = pPVar25;
  local_c8 = (function_call *)args_in;
  local_c0 = (function_call *)kwargs_in;
  do {
    bVar6 = *(byte *)((long)&hVar11.m_ptr[5].ob_type + 1);
    bVar19 = (bVar6 & 0x10) >> 4;
    hVar21.m_ptr = (PyObject *)
                   ((long)((char)(bVar6 << 2) >> 7) +
                   ((ulong)*(ushort *)((long)&hVar11.m_ptr[5].ob_type + 2) - (ulong)bVar19));
    if (((bVar19 != 0) || (pPVar25 <= hVar21.m_ptr)) &&
       ((hVar21.m_ptr <= pPVar25 ||
        (hVar21.m_ptr <=
         (PyObject *)(hVar11.m_ptr[2].ob_refcnt - (long)hVar11.m_ptr[1].ob_type >> 5))))) {
      local_118.simple_value_holder[2] = (function_call *)0x0;
      hStack_100.m_ptr = hStack_100.m_ptr & 0xffffffff00000000;
      local_118.simple_value_holder[1] =
           (void *)((ulong)local_118.simple_value_holder[1] & 0xffffffff00000000);
      phStack_120 = (handle *)0x0;
      local_118.simple_value_holder[0] = (function_call *)0x0;
      auStack_130._0_8_ = (PyObject *)0x0;
      auStack_130._8_8_ = (type_info *)0x0;
      local_e8.m_ptr = (PyObject *)0x0;
      local_f8 = (pointer)0x0;
      hStack_f0.m_ptr = (PyObject *)0x0;
      local_e0.m_ptr = (PyObject *)local_68;
      local_d8.m_ptr = (PyObject *)0x0;
      local_138 = (undefined1  [8])hVar11.m_ptr;
      std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::reserve
                ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_130,
                 (ulong)*(ushort *)((long)&hVar11.m_ptr[5].ob_type + 2));
      std::vector<bool,_std::allocator<bool>_>::reserve
                ((vector<bool,_std::allocator<bool>_> *)&local_118.nonsimple,
                 (ulong)*(ushort *)((long)&hVar11.m_ptr[5].ob_type + 2));
      local_d0 = hVar21.m_ptr;
      if (pPVar25 < hVar21.m_ptr) {
        local_d0 = pPVar25;
      }
      local_50.m_ptr = hVar21.m_ptr;
      if (((ulong)hVar11.m_ptr[5].ob_type & 0x200) == 0) {
        pPVar22 = (PyObject *)0x0;
      }
      else {
        if (*(PyObject **)local_98._24_8_ != (PyObject *)0x0) {
          (**(_func_void_value_and_holder_ptr **)(local_98._16_8_ + 0x38))
                    ((value_and_holder *)local_98);
        }
        if ((((PyTypeObject *)
             (local_c8->args).
             super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
             super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
          __assert_fail("PyTuple_Check(args_in)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Simon-Steinmann[P]ikfast_pybind_PR/ext/pybind11/include/pybind11/pybind11.h"
                        ,0x1fc,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        local_d8.m_ptr =
             (PyObject *)
             (local_c8->args).
             super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1c8._0_8_ = (function_call *)local_98;
        if ((handle *)auStack_130._8_8_ == phStack_120) {
          std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::
          _M_realloc_insert<pybind11::handle>
                    ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_130,
                     (iterator)auStack_130._8_8_,(handle *)local_1c8);
        }
        else {
          *(PyObject **)auStack_130._8_8_ = (PyObject *)local_98;
          auStack_130._8_8_ = auStack_130._8_8_ + 8;
        }
        pPVar22 = (PyObject *)0x1;
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)&local_118.nonsimple,false);
      }
      hVar21.m_ptr = pPVar22;
      if (pPVar22 < local_d0) {
        uVar18 = (ulong)(uint)((int)pPVar22 << 5);
        do {
          pPVar23 = hVar11.m_ptr[1].ob_type;
          if (pPVar22 < (PyObject *)(hVar11.m_ptr[2].ob_refcnt - (long)pPVar23 >> 5)) {
            plVar13 = (long *)((long)&(pPVar23->ob_base).ob_base.ob_refcnt + uVar18);
            bVar29 = pPVar23 != (PyTypeObject *)0x0;
            if ((((local_c0 != (function_call *)0x0) && (pPVar23 != (PyTypeObject *)0x0)) &&
                (bVar29 = true, *plVar13 != 0)) &&
               (lVar9 = PyDict_GetItemString(local_c0), lVar9 != 0)) {
LAB_0010ded6:
              bVar29 = false;
              pPVar25 = local_160;
              goto LAB_0010e239;
            }
            if ((((PyTypeObject *)
                 (local_c8->args).
                 super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
                 super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) goto LAB_0010ed74;
            local_1c8._0_8_ =
                 *(undefined8 *)
                  ((long)&(local_c8->args).
                          super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + (long)pPVar22 * 8);
            if (bVar29) {
              bVar29 = true;
              if (((*(byte *)((long)&pPVar23->tp_name + uVar18) & 2) == 0) &&
                 ((function_call *)local_1c8._0_8_ == (function_call *)&_Py_NoneStruct))
              goto LAB_0010ded6;
            }
            else {
              bVar29 = false;
            }
          }
          else {
            if ((((PyTypeObject *)
                 (local_c8->args).
                 super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
                 super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
LAB_0010ed74:
              __assert_fail("PyTuple_Check(args_in)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Simon-Steinmann[P]ikfast_pybind_PR/ext/pybind11/include/pybind11/pybind11.h"
                            ,0x20b,
                            "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                           );
            }
            local_1c8._0_8_ =
                 *(undefined8 *)
                  ((long)&(local_c8->args).
                          super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + (long)pPVar22 * 8);
            bVar29 = false;
            plVar13 = (long *)0x0;
          }
          if ((handle *)auStack_130._8_8_ == phStack_120) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<pybind11::handle_const&>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_130,
                       (iterator)auStack_130._8_8_,(handle *)local_1c8);
          }
          else {
            *(PyObject **)auStack_130._8_8_ = (PyObject *)local_1c8._0_8_;
            auStack_130._8_8_ = auStack_130._8_8_ + 8;
          }
          bVar6 = 1;
          if (bVar29) {
            bVar6 = *(byte *)(plVar13 + 3);
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_118.nonsimple,(bool)(bVar6 & 1));
          pPVar22 = (PyObject *)((long)&pPVar22->ob_refcnt + 1);
          uVar18 = uVar18 + 0x20;
          hVar21.m_ptr = local_d0;
          pPVar25 = local_160;
        } while (local_d0 != pPVar22);
      }
      local_b8.m_ptr = (PyObject *)local_c0;
      if (local_c0 != (function_call *)0x0) {
        ((PyObject *)&local_c0->func)->ob_refcnt = ((PyObject *)&local_c0->func)->ob_refcnt + 1;
      }
      if (hVar21.m_ptr < local_50.m_ptr) {
        lVar9 = (long)hVar21.m_ptr << 5;
        bVar29 = false;
        do {
          pPVar23 = hVar11.m_ptr[1].ob_type;
          local_1c8._0_8_ = (function_call *)0x0;
          if (((local_c0 == (function_call *)0x0) ||
              (*(long *)((long)&(pPVar23->ob_base).ob_base.ob_refcnt + lVar9) == 0)) ||
             (local_1c8._0_8_ = PyDict_GetItemString(local_b8.m_ptr),
             (function_call *)local_1c8._0_8_ == (function_call *)0x0)) {
            pfVar14 = *(function_call **)((long)&(pPVar23->ob_base).ob_size + lVar9);
            pfVar26 = (function_call *)local_1c8._0_8_;
            pPVar25 = local_160;
          }
          else {
            if (!bVar29) {
              local_198._0_8_ = PyDict_Copy(local_b8.m_ptr);
              object::operator=((object *)&local_b8,(object *)local_198);
              object::~object((object *)local_198);
            }
            PyDict_DelItemString
                      (local_b8.m_ptr,
                       *(undefined8 *)((long)&(pPVar23->ob_base).ob_base.ob_refcnt + lVar9));
            bVar29 = true;
            pfVar14 = (function_call *)local_1c8._0_8_;
            pfVar26 = (function_call *)local_1c8._0_8_;
            pPVar25 = local_160;
          }
          local_1c8._0_8_ = pfVar14;
          local_160 = pPVar25;
          if ((function_call *)local_1c8._0_8_ == (function_call *)0x0) {
            bVar29 = false;
            local_1c8._0_8_ = pfVar26;
            goto LAB_0010e22c;
          }
          if ((handle *)auStack_130._8_8_ == phStack_120) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<pybind11::handle_const&>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_130,
                       (iterator)auStack_130._8_8_,(handle *)local_1c8);
          }
          else {
            ((handle *)auStack_130._8_8_)->m_ptr = (PyObject *)local_1c8._0_8_;
            auStack_130._8_8_ = auStack_130._8_8_ + 8;
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_118.nonsimple,
                     (bool)(*(byte *)((long)&pPVar23->tp_name + lVar9) & 1));
          hVar21.m_ptr = (PyObject *)((long)&(hVar21.m_ptr)->ob_refcnt + 1);
          lVar9 = lVar9 + 0x20;
          pPVar25 = local_160;
        } while (hVar21.m_ptr < local_50.m_ptr);
      }
      if ((function_call *)local_b8.m_ptr == (function_call *)0x0) {
        bVar6 = *(byte *)((long)&hVar11.m_ptr[5].ob_type + 1);
LAB_0010de12:
        if ((bVar6 & 0x10) != 0) {
          tuple::tuple((tuple *)local_198,0);
          if (local_d0 == (PyObject *)0x0) {
            local_1c8._0_8_ = local_c8;
            ((PyObject *)&local_c8->func)->ob_refcnt = ((PyObject *)&local_c8->func)->ob_refcnt + 1;
LAB_0010df08:
            object::operator=((object *)local_198,(object *)local_1c8);
            object::~object((object *)local_1c8);
          }
          else {
            pfVar26 = (function_call *)((long)pPVar25 - (long)hVar21.m_ptr);
            if (pPVar25 < hVar21.m_ptr || pfVar26 == (function_call *)0x0) {
              tuple::tuple((tuple *)local_1c8,0);
              goto LAB_0010df08;
            }
            tuple::tuple((tuple *)local_1c8,(size_t)pfVar26);
            object::operator=((object *)local_198,(object *)local_1c8);
            object::~object((object *)local_1c8);
            hVar10.m_ptr = local_48.m_ptr;
            pfVar14 = (function_call *)0x0;
            do {
              if ((((PyTypeObject *)
                   (local_c8->args).
                   super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
                   super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
                __assert_fail("PyTuple_Check(args_in)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Simon-Steinmann[P]ikfast_pybind_PR/ext/pybind11/include/pybind11/pybind11.h"
                              ,0x24c,
                              "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                             );
              }
              local_1c8._8_8_ = local_198._0_8_;
              oStack_1b0.super_handle.m_ptr = (handle)(PyObject *)0x0;
              local_1c8._16_8_ = pfVar14;
              detail::accessor_policies::tuple_item::set
                        ((handle)local_198._0_8_,(size_t)pfVar14,
                         (PyObject *)
                         (&(hVar10.m_ptr)->ob_refcnt)
                         [(long)((long)&(hVar21.m_ptr)->ob_refcnt +
                                (long)&((PyObject *)&pfVar14->func)->ob_refcnt)]);
              object::~object((object *)(local_1c8 + 0x18));
              pfVar14 = (function_call *)((long)&((PyObject *)&pfVar14->func)->ob_refcnt + 1);
            } while (pfVar26 != pfVar14);
          }
          if ((handle *)auStack_130._8_8_ == phStack_120) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<pybind11::handle_const&>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_130,
                       (iterator)auStack_130._8_8_,(handle *)local_198);
          }
          else {
            *(PyObject **)auStack_130._8_8_ = (PyObject *)local_198._0_8_;
            auStack_130._8_8_ = auStack_130._8_8_ + 8;
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_118.nonsimple,false);
          object::operator=((object *)&hStack_f0,(object *)local_198);
          object::~object((object *)local_198);
          bVar6 = *(byte *)((long)&hVar11.m_ptr[5].ob_type + 1);
          pPVar25 = local_160;
        }
        if ((bVar6 & 0x20) != 0) {
          if ((function_call *)local_b8.m_ptr == (function_call *)0x0) {
            dict::dict((dict *)local_1c8);
            object::operator=((object *)&local_b8,(object *)local_1c8);
            object::~object((object *)local_1c8);
          }
          if ((handle *)auStack_130._8_8_ == phStack_120) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<pybind11::handle_const&>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_130,
                       (iterator)auStack_130._8_8_,&local_b8);
          }
          else {
            *(PyObject **)auStack_130._8_8_ = local_b8.m_ptr;
            auStack_130._8_8_ = auStack_130._8_8_ + 8;
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_118.nonsimple,false);
          object::operator=((object *)&local_e8,(object *)&local_b8);
        }
        __new_size = (long)(auStack_130._8_8_ - auStack_130._0_8_) >> 3;
        if ((__new_size != *(ushort *)((long)&hVar11.m_ptr[5].ob_type + 2)) ||
           (((ulong)hStack_100.m_ptr & 0xffffffff) +
            ((long)local_118.simple_value_holder[2] - local_118._0_8_) * 8 != __new_size)) {
          pybind11_fail(
                       "Internal error: function call dispatcher inserted wrong number of arguments!"
                       );
        }
        local_198._0_8_ = (PyObject *)0x0;
        local_198._8_8_ = local_198._8_8_ & 0xffffffff00000000;
        local_188._0_8_ = (function_record *)0x0;
        local_188._8_8_ = local_188._8_8_ & 0xffffffff00000000;
        local_178 = (pointer)0x0;
        if (local_58 != (hashfunc)0x0) {
          std::vector<bool,_std::allocator<bool>_>::resize
                    ((vector<bool,_std::allocator<bool>_> *)local_198,__new_size,false);
          phVar4 = local_f8;
          hVar21.m_ptr = hStack_100.m_ptr;
          uVar3 = local_118.simple_value_holder[2];
          uVar2 = local_118.simple_value_holder[1];
          uVar1 = local_118.simple_value_holder[0];
          local_1a8 = local_f8;
          local_1c8._16_8_ = local_118.simple_value_holder[2];
          oStack_1b0.super_handle.m_ptr = (handle)(handle)hStack_100.m_ptr;
          local_1c8._0_8_ = local_118.simple_value_holder[0];
          local_1c8._8_8_ = local_118.simple_value_holder[1];
          local_f8 = local_178;
          local_118.simple_value_holder[2] = (void *)local_188._0_8_;
          hStack_100.m_ptr = (PyObject *)local_188._8_8_;
          local_118.simple_value_holder[0] = (void *)local_198._0_8_;
          local_118.simple_value_holder[1] = (void *)local_198._8_8_;
          local_178 = phVar4;
          local_188._0_8_ = uVar3;
          local_188._8_8_ = hVar21.m_ptr;
          local_198._0_8_ = uVar1;
          local_198._8_8_ = uVar2;
        }
        detail::loader_life_support::loader_life_support((loader_life_support *)local_1c8);
        local_70 = (PyObject *)(*(code *)hVar11.m_ptr[3].ob_refcnt)(local_138);
        detail::loader_life_support::~loader_life_support((loader_life_support *)local_1c8);
        phVar4 = local_f8;
        hVar21.m_ptr = hStack_100.m_ptr;
        uVar3 = local_118.simple_value_holder[2];
        uVar2 = local_118.simple_value_holder[1];
        uVar1 = local_118.simple_value_holder[0];
        bVar29 = local_70 != (PyObject *)0x1;
        if (local_58 != (hashfunc)0x0 && !bVar29) {
          for (hVar10.m_ptr = (PyObject *)
                              (ulong)(*(byte *)((long)&hVar11.m_ptr[5].ob_type + 1) >> 6 & 1);
              hVar10.m_ptr < local_50.m_ptr;
              hVar10.m_ptr = (PyObject *)((long)&(hVar10.m_ptr)->ob_refcnt + 1)) {
            hVar20.m_ptr = (PyObject *)((long)&hVar10.m_ptr[3].ob_type + 7);
            if (-1 < (long)hVar10.m_ptr) {
              hVar20.m_ptr = hVar10.m_ptr;
            }
            if ((*(ulong *)(local_198._0_8_ +
                           (ulong)(((ulong)hVar10.m_ptr & 0x800000000000003f) < 0x8000000000000001)
                           * 8 + ((long)hVar20.m_ptr >> 6) * 8 + -8) >> ((ulong)hVar10.m_ptr & 0x3f)
                & 1) != 0) {
              local_1a8 = local_f8;
              local_1c8._16_8_ = local_118.simple_value_holder[2];
              oStack_1b0.super_handle.m_ptr = (handle)(handle)hStack_100.m_ptr;
              local_1c8._0_8_ = local_118.simple_value_holder[0];
              local_1c8._8_8_ = local_118.simple_value_holder[1];
              local_f8 = local_178;
              local_118.simple_value_holder[2] = (void *)local_188._0_8_;
              hStack_100.m_ptr = (PyObject *)local_188._8_8_;
              local_118.simple_value_holder[0] = (void *)local_198._0_8_;
              local_118.simple_value_holder[1] = (void *)local_198._8_8_;
              local_178 = phVar4;
              local_188._0_8_ = uVar3;
              local_188._8_8_ = hVar21.m_ptr;
              local_198._0_8_ = uVar1;
              local_198._8_8_ = uVar2;
              std::
              vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
              ::emplace_back<pybind11::detail::function_call>
                        ((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                          *)local_158,(function_call *)local_138);
              break;
            }
          }
          bVar29 = false;
        }
        if ((function_call *)local_198._0_8_ != (function_call *)0x0) {
          operator_delete((void *)local_198._0_8_,(long)local_178 - local_198._0_8_);
        }
      }
      else {
        lVar9 = PyDict_Size();
        bVar6 = *(byte *)((long)&hVar11.m_ptr[5].ob_type + 1);
        if ((lVar9 == 0) || ((bVar6 & 0x20) != 0)) goto LAB_0010de12;
        bVar29 = false;
      }
LAB_0010e22c:
      object::~object((object *)&local_b8);
LAB_0010e239:
      object::~object((object *)&local_e8);
      object::~object((object *)&hStack_f0);
      if ((function_call *)local_118.simple_value_holder[0] != (function_call *)0x0) {
        operator_delete(local_118.simple_value_holder[0],(long)local_f8 - local_118._0_8_);
        local_118.simple_value_holder[0] = (function_call *)0x0;
        local_118.simple_value_holder[1] =
             (void *)((ulong)local_118.simple_value_holder[1] & 0xffffffff00000000);
        local_118.simple_value_holder[2] = (function_call *)0x0;
        hStack_100.m_ptr = hStack_100.m_ptr & 0xffffffff00000000;
        local_f8 = (pointer)0x0;
      }
      if ((PyObject *)auStack_130._0_8_ != (PyObject *)0x0) {
        operator_delete((void *)auStack_130._0_8_,(long)phStack_120 - auStack_130._0_8_);
      }
      if (bVar29) break;
    }
    hVar11.m_ptr = (PyObject *)(((instance *)(hVar11.m_ptr + 7))->ob_base).ob_type;
  } while ((PyTypeObject *)hVar11.m_ptr != (PyTypeObject *)0x0);
  hVar11.m_ptr = local_70;
  uVar1 = local_158._8_8_;
  if ((local_58 == (hashfunc)0x0) || (local_158._0_8_ == local_158._8_8_)) {
    std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
    ~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
             *)local_158);
    if (hVar11.m_ptr != (PyObject *)0x1) goto LAB_0010e369;
  }
  else {
    if (local_70 != (PyObject *)0x1) {
LAB_0010e349:
      std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
      ::~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                 *)local_158);
LAB_0010e369:
      if (hVar11.m_ptr != (PyObject *)0x0) {
        if (((ulong)local_170->tp_repr & 0x100) == 0) {
          return hVar11.m_ptr;
        }
        if ((*(byte *)(local_98._0_8_ + 0x30) & 2) == 0) {
          bVar6 = *(byte *)((long)(((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                     *)(local_98._0_8_ + 0x18))->
                                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                  )._M_impl.super__Vector_impl_data._M_start +
                           (long)(PyObject **)local_98._8_8_);
        }
        else {
          bVar6 = *(byte *)(local_98._0_8_ + 0x30) >> 2;
        }
        if ((bVar6 & 1) == 0) {
          (**(_func_void_instance_ptr_void_ptr **)(local_98._16_8_ + 0x30))
                    ((instance *)local_68,(void *)0x0);
          return hVar11.m_ptr;
        }
        return hVar11.m_ptr;
      }
      local_138 = (undefined1  [8])(auStack_130 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_138,
                 "Unable to convert function return value to a Python type! The signature was\n\t",
                 "");
      std::__cxx11::string::append(local_138);
      lVar9 = std::__cxx11::string::find(local_138,0x1381c3,0);
      if (lVar9 != -1) {
        std::__cxx11::string::append(local_138);
      }
      PyErr_SetString(_PyExc_TypeError,local_138);
      if (local_138 == (undefined1  [8])(auStack_130 + 8)) {
        return (PyObject *)0x0;
      }
      goto LAB_0010ed4d;
    }
    pfVar26 = (function_call *)local_158._0_8_;
    do {
      detail::loader_life_support::loader_life_support((loader_life_support *)local_138);
      hVar11 = (*pfVar26->func->impl)(pfVar26);
      detail::loader_life_support::~loader_life_support((loader_life_support *)local_138);
      if (hVar11.m_ptr != (PyObject *)0x1) goto LAB_0010e349;
      pfVar26 = pfVar26 + 1;
    } while (pfVar26 != (function_call *)uVar1);
    std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
    ~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
             *)local_158);
  }
  if (((ulong)local_170->tp_repr & 0x800) != 0) {
    __Py_NotImplementedStruct = __Py_NotImplementedStruct + 1;
    return (PyObject *)&_Py_NotImplementedStruct;
  }
  std::__cxx11::string::string
            ((string *)local_158,(char *)(local_170->ob_base).ob_base.ob_refcnt,
             (allocator *)&local_168);
  puVar12 = (undefined8 *)std::__cxx11::string::append(local_158);
  local_198._0_8_ = local_188;
  pfVar26 = (function_call *)(puVar12 + 2);
  if ((function_call *)*puVar12 == pfVar26) {
    local_188._0_8_ = ((PyObject *)&pfVar26->func)->ob_refcnt;
    local_188._8_8_ = puVar12[3];
  }
  else {
    local_188._0_8_ = ((PyObject *)&pfVar26->func)->ob_refcnt;
    local_198._0_8_ = (PyObject *)*puVar12;
  }
  local_198._8_8_ = puVar12[1];
  *puVar12 = pfVar26;
  puVar12[1] = 0;
  *(undefined1 *)(puVar12 + 2) = 0;
  bVar6 = *(byte *)((long)&local_170->tp_repr + 1);
  iVar8 = 0x137f12;
  if ((bVar6 & 1) != 0) {
    iVar8 = 0x137f06;
  }
  local_b8.m_ptr = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,iVar8,iVar8 + (bVar6 & 1) * 3 + 8);
  pfVar24 = (function_record *)((long)&((PyObject *)local_198._8_8_)->ob_refcnt + local_b0);
  pfVar15 = (function_record *)0xf;
  if ((function_call *)local_198._0_8_ != (function_call *)local_188) {
    pfVar15 = (function_record *)local_188._0_8_;
  }
  if (pfVar15 < pfVar24) {
    pfVar15 = (function_record *)0xf;
    if (local_b8.m_ptr != &local_a8) {
      pfVar15 = (function_record *)local_a8.ob_refcnt;
    }
    if (pfVar15 < pfVar24) goto LAB_0010e5f8;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,local_198._0_8_);
  }
  else {
LAB_0010e5f8:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append(local_198,(ulong)local_b8.m_ptr);
  }
  local_1c8._0_8_ = local_1c8 + 0x10;
  pfVar26 = (function_call *)(puVar12 + 2);
  if ((function_call *)*puVar12 == pfVar26) {
    local_1c8._16_8_ = ((PyObject *)&pfVar26->func)->ob_refcnt;
    oStack_1b0.super_handle.m_ptr = (handle)puVar12[3];
  }
  else {
    local_1c8._16_8_ = ((PyObject *)&pfVar26->func)->ob_refcnt;
    local_1c8._0_8_ = (function_call *)*puVar12;
  }
  local_1c8._8_8_ = puVar12[1];
  *puVar12 = pfVar26;
  puVar12[1] = 0;
  *(undefined1 *)&((PyObject *)&pfVar26->func)->ob_refcnt = 0;
  plVar13 = (long *)std::__cxx11::string::append(local_1c8);
  local_138 = (undefined1  [8])(auStack_130 + 8);
  piVar17 = (instance *)(plVar13 + 2);
  if ((instance *)*plVar13 == piVar17) {
    auStack_130._8_8_ = (piVar17->ob_base).ob_refcnt;
    phStack_120 = (handle *)plVar13[3];
  }
  else {
    auStack_130._8_8_ = (piVar17->ob_base).ob_refcnt;
    local_138 = (undefined1  [8])*plVar13;
  }
  auStack_130._0_8_ = plVar13[1];
  *plVar13 = (long)piVar17;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  if ((function_call *)local_1c8._0_8_ != (function_call *)(local_1c8 + 0x10)) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
  if (local_b8.m_ptr != &local_a8) {
    operator_delete(local_b8.m_ptr,(ulong)((long)&((PyObject *)local_a8.ob_refcnt)->ob_refcnt + 1));
  }
  if ((function_call *)local_198._0_8_ != (function_call *)local_188) {
    operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
  }
  if ((function_call *)local_158._0_8_ != (function_call *)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_,(ulong)((long)(function_record **)local_158._16_8_ + 1))
    ;
  }
  pPVar23 = local_170;
  uVar27 = 0;
  do {
    __val = uVar27 + 1;
    __len = 1;
    if (8 < uVar27) {
      uVar18 = (ulong)__val;
      uVar27 = 4;
      do {
        __len = uVar27;
        uVar7 = (uint)uVar18;
        if (uVar7 < 100) {
          __len = __len - 2;
          goto LAB_0010e799;
        }
        if (uVar7 < 1000) {
          __len = __len - 1;
          goto LAB_0010e799;
        }
        if (uVar7 < 10000) goto LAB_0010e799;
        uVar18 = uVar18 / 10000;
        uVar27 = __len + 4;
      } while (99999 < uVar7);
      __len = __len + 1;
    }
LAB_0010e799:
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_158,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_158._0_8_,__len,__val);
    puVar12 = (undefined8 *)std::__cxx11::string::replace((ulong)local_158,0,(char *)0x0,0x137262);
    local_198._0_8_ = local_188;
    pfVar26 = (function_call *)(puVar12 + 2);
    if ((function_call *)*puVar12 == pfVar26) {
      local_188._0_8_ = ((PyObject *)&pfVar26->func)->ob_refcnt;
      local_188._8_8_ = puVar12[3];
    }
    else {
      local_188._0_8_ = ((PyObject *)&pfVar26->func)->ob_refcnt;
      local_198._0_8_ = (PyObject *)*puVar12;
    }
    local_198._8_8_ = puVar12[1];
    *puVar12 = pfVar26;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    puVar12 = (undefined8 *)std::__cxx11::string::append(local_198);
    local_1c8._0_8_ = local_1c8 + 0x10;
    pfVar26 = (function_call *)(puVar12 + 2);
    if ((function_call *)*puVar12 == pfVar26) {
      local_1c8._16_8_ = ((PyObject *)&pfVar26->func)->ob_refcnt;
      oStack_1b0.super_handle.m_ptr = (handle)puVar12[3];
    }
    else {
      local_1c8._16_8_ = ((PyObject *)&pfVar26->func)->ob_refcnt;
      local_1c8._0_8_ = (function_call *)*puVar12;
    }
    local_1c8._8_8_ = puVar12[1];
    *puVar12 = pfVar26;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_138,local_1c8._0_8_);
    if ((function_call *)local_1c8._0_8_ != (function_call *)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
    }
    if ((function_call *)local_198._0_8_ != (function_call *)local_188) {
      operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
    }
    if ((function_call *)local_158._0_8_ != (function_call *)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_,
                      (ulong)((long)(function_record **)local_158._16_8_ + 1));
    }
    if (((ulong)local_170->tp_repr & 0x100) == 0) {
LAB_0010ea12:
      std::__cxx11::string::append((char *)local_138);
    }
    else {
      std::__cxx11::string::string
                ((string *)local_1c8,(char *)(pPVar23->ob_base).ob_size,(allocator *)local_198);
      lVar9 = std::__cxx11::string::find((char)local_1c8,0x28);
      pfVar26 = (function_call *)(lVar9 + 7);
      if ((ulong)local_1c8._8_8_ <= pfVar26) {
LAB_0010e9f7:
        if ((function_call *)local_1c8._0_8_ != (function_call *)(local_1c8 + 0x10)) {
          operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
        }
        goto LAB_0010ea12;
      }
      pfVar14 = (function_call *)std::__cxx11::string::find(local_1c8,0x139492,0);
      local_d0 = (PyObject *)std::__cxx11::string::rfind(local_1c8,0x137f54,0xffffffffffffffff);
      if (pfVar14 < (ulong)local_1c8._8_8_) {
        pfVar28 = (function_call *)((long)&((PyObject *)&pfVar14->func)->ob_refcnt + 2);
      }
      else {
        pfVar14 = (function_call *)std::__cxx11::string::find((char)local_1c8,0x29);
        pfVar28 = pfVar14;
      }
      if ((pfVar14 <= pfVar26) || ((ulong)local_1c8._8_8_ <= pfVar28)) goto LAB_0010e9f7;
      std::__cxx11::string::append((string *)local_138,(ulong)local_1c8,(ulong)pfVar26);
      std::__cxx11::string::push_back((char)(string *)local_138);
      std::__cxx11::string::append((string *)local_138,(ulong)local_1c8,(ulong)pfVar28);
      if ((function_call *)local_1c8._0_8_ != (function_call *)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
      }
    }
    std::__cxx11::string::append((char *)local_138);
    pPVar23 = (PyTypeObject *)pPVar23->tp_hash;
    uVar27 = __val;
  } while (pPVar23 != (PyTypeObject *)0x0);
  std::__cxx11::string::append(local_138);
  local_b8.m_ptr = (PyObject *)local_c8;
  if (local_c8 != (function_call *)0x0) {
    ((PyObject *)&local_c8->func)->ob_refcnt = ((PyObject *)&local_c8->func)->ob_refcnt + 1;
  }
  bVar29 = false;
  for (pfVar24 = (function_record *)(ulong)(*(byte *)((long)&local_170->tp_repr + 1) & 1);
      pfVar15 = (function_record *)PyTuple_Size(local_b8.m_ptr), pfVar24 < pfVar15;
      pfVar24 = (function_record *)((long)&((PyObject *)&pfVar24->name)->ob_refcnt + 1)) {
    bVar5 = true;
    if (bVar29) {
      std::__cxx11::string::append(local_138);
      bVar5 = bVar29;
    }
    bVar29 = bVar5;
    local_198._8_8_ = local_b8.m_ptr;
    local_188._8_8_ = (PyObject *)0x0;
    local_188._0_8_ = pfVar24;
    poVar16 = detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                        ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_198);
    local_168.m_ptr = (poVar16->super_handle).m_ptr;
    if ((function_call *)local_168.m_ptr != (function_call *)0x0) {
      ((PyObject *)&(local_168.m_ptr)->ob_refcnt)->ob_refcnt =
           ((PyObject *)&(local_168.m_ptr)->ob_refcnt)->ob_refcnt + 1;
    }
    hVar11.m_ptr = (PyObject *)PyObject_Repr(local_168.m_ptr);
    if ((function_call *)hVar11.m_ptr == (function_call *)0x0) {
      this = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this);
      __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
    local_158._0_8_ = hVar11.m_ptr;
    str::operator_cast_to_string((string *)local_1c8,(str *)local_158);
    std::__cxx11::string::_M_append(local_138,local_1c8._0_8_);
    if ((function_call *)local_1c8._0_8_ != (function_call *)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
    }
    object::~object((object *)local_158);
    object::~object((object *)&local_168);
    object::~object((object *)(local_188 + 8));
  }
  if (local_c0 != (function_call *)0x0) {
    local_168.m_ptr = (PyObject *)local_c0;
    ((PyObject *)&local_c0->func)->ob_refcnt = ((PyObject *)&local_c0->func)->ob_refcnt + 1;
    lVar9 = PyDict_Size();
    if (lVar9 != 0) {
      if (bVar29) {
        std::__cxx11::string::append(local_138);
      }
      std::__cxx11::string::append(local_138);
      local_1c8._0_8_ = local_168.m_ptr;
      local_1c8._8_8_ = (function_call *)0x0;
      local_1c8._16_8_ = (function_call *)0x0;
      oStack_1b0.super_handle.m_ptr = (handle)(PyObject *)0x0;
      iVar8 = PyDict_Next();
      if ((iVar8 != 0) && (oStack_1b0.super_handle.m_ptr != (PyObject *)0xffffffffffffffff)) {
        local_158._0_8_ = local_1c8._8_8_;
        local_158._8_8_ = local_1c8._16_8_;
        while( true ) {
          str::str((str *)&local_40,"{}={!r}");
          str::format<pybind11::handle&,pybind11::handle&>
                    ((str *)&local_38,&local_40,(handle *)local_158);
          str::operator_cast_to_string((string *)local_198,(str *)&local_38);
          std::__cxx11::string::_M_append(local_138,local_198._0_8_);
          if ((PyObject *)local_198._0_8_ != (PyObject *)local_188) {
            operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
          }
          object::~object(&local_38);
          object::~object((object *)&local_40);
          iVar8 = PyDict_Next(local_1c8._0_8_,local_1c8 + 0x18,local_1c8 + 8,local_1c8 + 0x10);
          if ((iVar8 == 0) || (oStack_1b0.super_handle.m_ptr == (PyObject *)0xffffffffffffffff))
          break;
          local_158._0_8_ = local_1c8._8_8_;
          local_158._8_8_ = local_1c8._16_8_;
          std::__cxx11::string::append(local_138);
        }
      }
    }
    object::~object((object *)&local_168);
  }
  lVar9 = std::__cxx11::string::find(local_138,0x1381c3,0);
  if (lVar9 != -1) {
    std::__cxx11::string::append(local_138);
  }
  PyErr_SetString(_PyExc_TypeError,local_138);
  object::~object((object *)&local_b8);
  if (local_138 == (undefined1  [8])(auStack_130 + 8)) {
    return (PyObject *)0x0;
  }
LAB_0010ed4d:
  operator_delete((void *)local_138,(ulong)((long)(PyTypeObject **)auStack_130._8_8_ + 1));
  return (PyObject *)0x0;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args_in, PyObject *kwargs_in) {
        using namespace detail;

        /* Iterator over the list of potentially admissible overloads */
        const function_record *overloads = (function_record *) PyCapsule_GetPointer(self, nullptr),
                              *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        const size_t n_args_in = (size_t) PyTuple_GET_SIZE(args_in);

        handle parent = n_args_in > 0 ? PyTuple_GET_ITEM(args_in, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;

        auto self_value_and_holder = value_and_holder();
        if (overloads->is_constructor) {
            const auto tinfo = get_type_info((PyTypeObject *) overloads->scope.ptr());
            const auto pi = reinterpret_cast<instance *>(parent.ptr());
            self_value_and_holder = pi->get_value_and_holder(tinfo, false);

            if (!self_value_and_holder.type || !self_value_and_holder.inst) {
                PyErr_SetString(PyExc_TypeError, "__init__(self, ...) called with invalid `self` argument");
                return nullptr;
            }

            // If this value is already registered it must mean __init__ is invoked multiple times;
            // we really can't support that in C++, so just ignore the second __init__.
            if (self_value_and_holder.instance_registered())
                return none().release().ptr();
        }

        try {
            // We do this in two passes: in the first pass, we load arguments with `convert=false`;
            // in the second, we allow conversion (except for arguments with an explicit
            // py::arg().noconvert()).  This lets us prefer calls without conversion, with
            // conversion as a fallback.
            std::vector<function_call> second_pass;

            // However, if there are no overloads, we can just skip the no-convert pass entirely
            const bool overloaded = it != nullptr && it->next != nullptr;

            for (; it != nullptr; it = it->next) {

                /* For each overload:
                   1. Copy all positional arguments we were given, also checking to make sure that
                      named positional arguments weren't *also* specified via kwarg.
                   2. If we weren't given enough, try to make up the omitted ones by checking
                      whether they were provided by a kwarg matching the `py::arg("name")` name.  If
                      so, use it (and remove it from kwargs; if not, see if the function binding
                      provided a default that we can use.
                   3. Ensure that either all keyword arguments were "consumed", or that the function
                      takes a kwargs argument to accept unconsumed kwargs.
                   4. Any positional arguments still left get put into a tuple (for args), and any
                      leftover kwargs get put into a dict.
                   5. Pack everything into a vector; if we have py::args or py::kwargs, they are an
                      extra tuple or dict at the end of the positional arguments.
                   6. Call the function call dispatcher (function_record::impl)

                   If one of these fail, move on to the next overload and keep trying until we get a
                   result other than PYBIND11_TRY_NEXT_OVERLOAD.
                 */

                const function_record &func = *it;
                size_t pos_args = func.nargs;    // Number of positional arguments that we need
                if (func.has_args) --pos_args;   // (but don't count py::args
                if (func.has_kwargs) --pos_args; //  or py::kwargs)

                if (!func.has_args && n_args_in > pos_args)
                    continue; // Too many arguments for this overload

                if (n_args_in < pos_args && func.args.size() < pos_args)
                    continue; // Not enough arguments given, and not enough defaults to fill in the blanks

                function_call call(func, parent);

                size_t args_to_copy = (std::min)(pos_args, n_args_in); // Protect std::min with parentheses
                size_t args_copied = 0;

                // 0. Inject new-style `self` argument
                if (func.is_new_style_constructor) {
                    // The `value` may have been preallocated by an old-style `__init__`
                    // if it was a preceding candidate for overload resolution.
                    if (self_value_and_holder)
                        self_value_and_holder.type->dealloc(self_value_and_holder);

                    call.init_self = PyTuple_GET_ITEM(args_in, 0);
                    call.args.push_back(reinterpret_cast<PyObject *>(&self_value_and_holder));
                    call.args_convert.push_back(false);
                    ++args_copied;
                }

                // 1. Copy any position arguments given.
                bool bad_arg = false;
                for (; args_copied < args_to_copy; ++args_copied) {
                    const argument_record *arg_rec = args_copied < func.args.size() ? &func.args[args_copied] : nullptr;
                    if (kwargs_in && arg_rec && arg_rec->name && PyDict_GetItemString(kwargs_in, arg_rec->name)) {
                        bad_arg = true;
                        break;
                    }

                    handle arg(PyTuple_GET_ITEM(args_in, args_copied));
                    if (arg_rec && !arg_rec->none && arg.is_none()) {
                        bad_arg = true;
                        break;
                    }
                    call.args.push_back(arg);
                    call.args_convert.push_back(arg_rec ? arg_rec->convert : true);
                }
                if (bad_arg)
                    continue; // Maybe it was meant for another overload (issue #688)

                // We'll need to copy this if we steal some kwargs for defaults
                dict kwargs = reinterpret_borrow<dict>(kwargs_in);

                // 2. Check kwargs and, failing that, defaults that may help complete the list
                if (args_copied < pos_args) {
                    bool copied_kwargs = false;

                    for (; args_copied < pos_args; ++args_copied) {
                        const auto &arg = func.args[args_copied];

                        handle value;
                        if (kwargs_in && arg.name)
                            value = PyDict_GetItemString(kwargs.ptr(), arg.name);

                        if (value) {
                            // Consume a kwargs value
                            if (!copied_kwargs) {
                                kwargs = reinterpret_steal<dict>(PyDict_Copy(kwargs.ptr()));
                                copied_kwargs = true;
                            }
                            PyDict_DelItemString(kwargs.ptr(), arg.name);
                        } else if (arg.value) {
                            value = arg.value;
                        }

                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg.convert);
                        }
                        else
                            break;
                    }

                    if (args_copied < pos_args)
                        continue; // Not enough arguments, defaults, or kwargs to fill the positional arguments
                }

                // 3. Check everything was consumed (unless we have a kwargs arg)
                if (kwargs && kwargs.size() > 0 && !func.has_kwargs)
                    continue; // Unconsumed kwargs, but no py::kwargs argument to accept them

                // 4a. If we have a py::args argument, create a new tuple with leftovers
                if (func.has_args) {
                    tuple extra_args;
                    if (args_to_copy == 0) {
                        // We didn't copy out any position arguments from the args_in tuple, so we
                        // can reuse it directly without copying:
                        extra_args = reinterpret_borrow<tuple>(args_in);
                    } else if (args_copied >= n_args_in) {
                        extra_args = tuple(0);
                    } else {
                        size_t args_size = n_args_in - args_copied;
                        extra_args = tuple(args_size);
                        for (size_t i = 0; i < args_size; ++i) {
                            extra_args[i] = PyTuple_GET_ITEM(args_in, args_copied + i);
                        }
                    }
                    call.args.push_back(extra_args);
                    call.args_convert.push_back(false);
                    call.args_ref = std::move(extra_args);
                }

                // 4b. If we have a py::kwargs, pass on any remaining kwargs
                if (func.has_kwargs) {
                    if (!kwargs.ptr())
                        kwargs = dict(); // If we didn't get one, send an empty one
                    call.args.push_back(kwargs);
                    call.args_convert.push_back(false);
                    call.kwargs_ref = std::move(kwargs);
                }

                // 5. Put everything in a vector.  Not technically step 5, we've been building it
                // in `call.args` all along.
                #if !defined(NDEBUG)
                if (call.args.size() != func.nargs || call.args_convert.size() != func.nargs)
                    pybind11_fail("Internal error: function call dispatcher inserted wrong number of arguments!");
                #endif

                std::vector<bool> second_pass_convert;
                if (overloaded) {
                    // We're in the first no-convert pass, so swap out the conversion flags for a
                    // set of all-false flags.  If the call fails, we'll swap the flags back in for
                    // the conversion-allowed call below.
                    second_pass_convert.resize(func.nargs, false);
                    call.args_convert.swap(second_pass_convert);
                }

                // 6. Call the function.
                try {
                    loader_life_support guard{};
                    result = func.impl(call);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;

                if (overloaded) {
                    // The (overloaded) call failed; if the call has at least one argument that
                    // permits conversion (i.e. it hasn't been explicitly specified `.noconvert()`)
                    // then add this call to the list of second pass overloads to try.
                    for (size_t i = func.is_method ? 1 : 0; i < pos_args; i++) {
                        if (second_pass_convert[i]) {
                            // Found one: swap the converting flags back in and store the call for
                            // the second pass.
                            call.args_convert.swap(second_pass_convert);
                            second_pass.push_back(std::move(call));
                            break;
                        }
                    }
                }
            }

            if (overloaded && !second_pass.empty() && result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
                // The no-conversion pass finished without success, try again with conversion allowed
                for (auto &call : second_pass) {
                    try {
                        loader_life_support guard{};
                        result = call.func.impl(call);
                    } catch (reference_cast_error &) {
                        result = PYBIND11_TRY_NEXT_OVERLOAD;
                    }

                    if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD) {
                        // The error reporting logic below expects 'it' to be valid, as it would be
                        // if we'd encountered this failure in the first-pass loop.
                        if (!result)
                            it = &call.func;
                        break;
                    }
                }
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
#if defined(__GNUG__) && !defined(__clang__)
        } catch ( abi::__forced_unwind& ) {
            throw;
#endif
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        auto append_note_if_missing_header_is_suspected = [](std::string &msg) {
            if (msg.find("std::") != std::string::npos) {
                msg += "\n\n"
                       "Did you forget to `#include <pybind11/stl.h>`? Or <pybind11/complex.h>,\n"
                       "<pybind11/functional.h>, <pybind11/chrono.h>, etc. Some automatic\n"
                       "conversions are optional and require extra headers to be included\n"
                       "when compiling your pybind11 module.";
            }
        };

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (const function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args_in);
            bool some_args = false;
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                if (!some_args) some_args = true;
                else msg += ", ";
                msg += pybind11::repr(args_[ti]);
            }
            if (kwargs_in) {
                auto kwargs = reinterpret_borrow<dict>(kwargs_in);
                if (kwargs.size() > 0) {
                    if (some_args) msg += "; ";
                    msg += "kwargs: ";
                    bool first = true;
                    for (auto kwarg : kwargs) {
                        if (first) first = false;
                        else msg += ", ";
                        msg += pybind11::str("{}={!r}").format(kwarg.first, kwarg.second);
                    }
                }
            }

            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor && !self_value_and_holder.holder_constructed()) {
                auto *pi = reinterpret_cast<instance *>(parent.ptr());
                self_value_and_holder.type->init_instance(pi, nullptr);
            }
            return result.ptr();
        }
    }